

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool __thiscall
ImFontAtlas::GetMouseCursorTexData
          (ImFontAtlas *this,ImGuiMouseCursor cursor_type,ImVec2 *out_offset,ImVec2 *out_size,
          ImVec2 *out_uv_border,ImVec2 *out_uv_fill)

{
  undefined2 uVar1;
  undefined2 uVar3;
  undefined4 uVar4;
  ImVec2 IVar2;
  undefined1 auVar5 [16];
  ImVec2 IVar6;
  float fVar7;
  ImFontAtlasCustomRect *pIVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  if (((uint)cursor_type < 9) && ((this->Flags & 2) == 0)) {
    IVar6 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][2];
    pIVar8 = (this->CustomRects).Data + this->CustomRectIds[0];
    uVar1 = pIVar8->X;
    uVar3 = pIVar8->Y;
    uVar4 = pIVar8->GlyphAdvanceX;
    auVar5._4_4_ = uVar4;
    auVar5._2_2_ = uVar3;
    auVar5._0_2_ = uVar1;
    auVar5._8_8_ = 0;
    auVar5 = vpmovzxwd_avx(auVar5);
    auVar5 = vcvtdq2ps_avx(auVar5);
    IVar2 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1];
    auVar9._0_4_ = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][0].x + auVar5._0_4_;
    auVar9._4_4_ = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][0].y + auVar5._4_4_;
    auVar9._8_4_ = auVar5._8_4_ + 0.0;
    auVar9._12_4_ = auVar5._12_4_ + 0.0;
    *out_size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1];
    *out_offset = IVar6;
    auVar12._0_4_ = auVar9._0_4_ * (this->TexUvScale).x;
    auVar12._4_4_ = auVar9._4_4_ * (this->TexUvScale).y;
    auVar12._8_4_ = auVar9._8_4_ * 0.0;
    auVar12._12_4_ = auVar9._12_4_ * 0.0;
    IVar6 = (ImVec2)vmovlps_avx(auVar12);
    *out_uv_border = IVar6;
    fVar7 = IVar2.x;
    auVar13._0_4_ = auVar9._0_4_ + fVar7;
    auVar13._4_4_ = auVar9._4_4_ + IVar2.y;
    auVar13._8_4_ = auVar9._8_4_ + 0.0;
    auVar13._12_4_ = auVar9._12_4_ + 0.0;
    auVar14._0_4_ = auVar13._0_4_ * (this->TexUvScale).x;
    auVar14._4_4_ = auVar13._4_4_ * (this->TexUvScale).y;
    auVar14._8_4_ = auVar13._8_4_ * 0.0;
    auVar14._12_4_ = auVar13._12_4_ * 0.0;
    IVar2 = (ImVec2)vmovlps_avx(auVar14);
    out_uv_border[1] = IVar2;
    auVar5 = vblendps_avx(ZEXT416((uint)(auVar9._0_4_ + 109.0)),auVar9,2);
    auVar10._0_4_ = auVar5._0_4_ * (this->TexUvScale).x;
    auVar10._4_4_ = auVar5._4_4_ * (this->TexUvScale).y;
    auVar10._8_4_ = auVar5._8_4_ * 0.0;
    auVar10._12_4_ = auVar5._12_4_ * 0.0;
    IVar2 = (ImVec2)vmovlps_avx(auVar10);
    *out_uv_fill = IVar2;
    auVar5 = vblendps_avx(ZEXT416((uint)(auVar9._0_4_ + 109.0 + fVar7)),auVar13,2);
    auVar11._0_4_ = auVar5._0_4_ * (this->TexUvScale).x;
    auVar11._4_4_ = auVar5._4_4_ * (this->TexUvScale).y;
    auVar11._8_4_ = auVar5._8_4_ * 0.0;
    auVar11._12_4_ = auVar5._12_4_ * 0.0;
    IVar2 = (ImVec2)vmovlps_avx(auVar11);
    out_uv_fill[1] = IVar2;
    return true;
  }
  return false;
}

Assistant:

bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor cursor_type, ImVec2* out_offset, ImVec2* out_size, ImVec2 out_uv_border[2], ImVec2 out_uv_fill[2])
{
    if (cursor_type <= ImGuiMouseCursor_None || cursor_type >= ImGuiMouseCursor_COUNT)
        return false;
    if (Flags & ImFontAtlasFlags_NoMouseCursors)
        return false;

    IM_ASSERT(CustomRectIds[0] != -1);
    ImFontAtlasCustomRect& r = CustomRects[CustomRectIds[0]];
    IM_ASSERT(r.ID == FONT_ATLAS_DEFAULT_TEX_DATA_ID);
    ImVec2 pos = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][0] + ImVec2((float)r.X, (float)r.Y);
    ImVec2 size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][1];
    *out_size = size;
    *out_offset = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][2];
    out_uv_border[0] = (pos) * TexUvScale;
    out_uv_border[1] = (pos + size) * TexUvScale;
    pos.x += FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF + 1;
    out_uv_fill[0] = (pos) * TexUvScale;
    out_uv_fill[1] = (pos + size) * TexUvScale;
    return true;
}